

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1711(ParserTester *this)

{
  Expectation *pEVar1;
  allocator<char> local_199;
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"( int ) -",&local_199);
  Expectation::Expectation(&local_178);
  pEVar1 = Expectation::setErrorCnt(&local_178,1);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void ParserTester::case1711()
{
    parseExpression("( int ) -",
                    Expectation().setErrorCnt(1));
}